

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TOICompactRewardDecPOMDPDiscrete.cpp
# Opt level: O1

void __thiscall
TOICompactRewardDecPOMDPDiscrete::TOICompactRewardDecPOMDPDiscrete
          (TOICompactRewardDecPOMDPDiscrete *this,TOICompactRewardDecPOMDPDiscrete *o)

{
  undefined8 *puVar1;
  string local_90;
  string local_70;
  string local_50;
  
  *(undefined8 *)&this->field_0x308 = 0x5d9840;
  *(undefined8 *)&this->field_0x310 = 0x5d9a98;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"received unspec. by TOIDecPOMDPDiscrete","");
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"received unspec. by TOIDecPOMDPDiscrete","");
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,"received unspec. by TOIDecPOMDPDiscrete","");
  TOIDecPOMDPDiscrete::TOIDecPOMDPDiscrete
            (&this->super_TOIDecPOMDPDiscrete,&PTR_construction_vtable_96__005d85d8,&local_50,
             &local_70,&local_90,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  *(undefined8 *)
   &(this->super_TOIDecPOMDPDiscrete).super_TransitionObservationIndependentMADPDiscrete.
    super_MultiAgentDecisionProcess = 0x5d7e20;
  *(undefined8 *)&this->field_0x308 = 0x5d8200;
  *(undefined8 *)&this->field_0x310 = 0x5d8458;
  *(undefined8 *)
   &(this->super_TOIDecPOMDPDiscrete).super_TransitionObservationIndependentMADPDiscrete.field_0x280
       = 0x5d8078;
  *(undefined8 *)&(this->super_TOIDecPOMDPDiscrete).field_0x2c0 = 0;
  *(undefined8 *)&this->field_0x2c8 = 0;
  *(undefined8 *)&this->field_0x2d0 = 0;
  (this->_m_nrTwoAgentActions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_nrTwoAgentActions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_nrTwoAgentActions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_m_p_rModels).super__Vector_base<RewardModel_*,_std::allocator<RewardModel_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_p_rModels).super__Vector_base<RewardModel_*,_std::allocator<RewardModel_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_p_rModels).super__Vector_base<RewardModel_*,_std::allocator<RewardModel_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar1 = (undefined8 *)__cxa_allocate_exception(0x28);
  *puVar1 = &PTR__E_0059bd80;
  puVar1[1] = puVar1 + 3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(puVar1 + 1),
             "TOICompactRewardDecPOMDPDiscrete: copy ctor not yet implemented","");
  __cxa_throw(puVar1,&E::typeinfo,E::~E);
}

Assistant:

TOICompactRewardDecPOMDPDiscrete::
TOICompactRewardDecPOMDPDiscrete(const TOICompactRewardDecPOMDPDiscrete& o) 
{
    throw(E("TOICompactRewardDecPOMDPDiscrete: copy ctor not yet implemented"));
}